

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetKeyOwner(ImGuiKey key,ImGuiID owner_id,ImGuiInputFlags flags)

{
  ImGuiKeyOwnerData *pIVar1;
  uint in_EDX;
  ImGuiID in_ESI;
  ImGuiKeyOwnerData *owner_data;
  byte local_19;
  
  pIVar1 = GetKeyOwnerData(ImGuiKey_KeysData_OFFSET);
  pIVar1->OwnerNext = in_ESI;
  pIVar1->OwnerCurr = in_ESI;
  pIVar1->LockUntilRelease = (in_EDX & 0x80) != 0;
  local_19 = 1;
  if ((in_EDX & 0x40) == 0) {
    local_19 = pIVar1->LockUntilRelease;
  }
  pIVar1->LockThisFrame = (bool)(local_19 & 1);
  return;
}

Assistant:

void ImGui::SetKeyOwner(ImGuiKey key, ImGuiID owner_id, ImGuiInputFlags flags)
{
    IM_ASSERT(IsNamedKeyOrModKey(key) && (owner_id != ImGuiKeyOwner_Any || (flags & (ImGuiInputFlags_LockThisFrame | ImGuiInputFlags_LockUntilRelease)))); // Can only use _Any with _LockXXX flags (to eat a key away without an ID to retrieve it)
    IM_ASSERT((flags & ~ImGuiInputFlags_SupportedBySetKeyOwner) == 0); // Passing flags not supported by this function!

    ImGuiKeyOwnerData* owner_data = GetKeyOwnerData(key);
    owner_data->OwnerCurr = owner_data->OwnerNext = owner_id;

    // We cannot lock by default as it would likely break lots of legacy code.
    // In the case of using LockUntilRelease while key is not down we still lock during the frame (no key_data->Down test)
    owner_data->LockUntilRelease = (flags & ImGuiInputFlags_LockUntilRelease) != 0;
    owner_data->LockThisFrame = (flags & ImGuiInputFlags_LockThisFrame) != 0 || (owner_data->LockUntilRelease);
}